

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer piVar4;
  int32_t iVar5;
  pointer piVar6;
  ulong uVar7;
  int *piVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_01;
  Vector norms;
  allocator_type local_51;
  Vector local_50;
  value_type_conflict1 local_34;
  
  Vector::Vector(&local_50,
                 ((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_);
  Matrix::l2NormRow((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,&local_50);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_,&local_34,&local_51);
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar6) {
    auVar9 = vpbroadcastq_avx512f();
    auVar9 = vpsrlq_avx512f(auVar9,2);
    auVar10 = vpmovsxbd_avx512f(_DAT_0012de30);
    uVar7 = 0;
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vporq_avx512f(auVar14,auVar11);
      auVar14 = vporq_avx512f(auVar14,auVar12);
      vpcmpuq_avx512f(auVar14,auVar9,2);
      vpcmpuq_avx512f(auVar15,auVar9,2);
      auVar14 = vmovdqu32_avx512f(auVar10);
      *(undefined1 (*) [64])(piVar3 + uVar7) = auVar14;
      uVar7 = uVar7 + 0x10;
      auVar10 = vpaddd_avx512f(auVar10,auVar13);
    } while ((((ulong)((long)piVar6 + (-4 - (long)piVar3)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar7);
  }
  iVar5 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(string *)&Dictionary::EOS_abi_cxx11_);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.eosid = iVar5;
    __comp._M_comp.norms = &local_50;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 2) *
                            2) ^ 0x7e,__comp);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      __comp_01._M_comp.eosid = iVar5;
      __comp_01._M_comp.norms = &local_50;
      __comp_01._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last,__comp_01);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar5;
      __comp_00._M_comp.norms = &local_50;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        iVar1 = *__last_00._M_current;
        piVar8 = __last_00._M_current;
        while ((iVar2 = piVar8[-1], iVar1 == iVar5 ||
               ((iVar2 != iVar5 &&
                (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2] <
                 local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1]))))) {
          *piVar8 = iVar2;
          piVar8 = piVar8 + -1;
        }
        *piVar8 = iVar1;
      }
    }
  }
  piVar6 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start + cutoff;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((piVar6 != piVar3) &&
     (piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     piVar6 = (pointer)((long)piVar6 + ((long)piVar4 - (long)piVar3)), piVar4 != piVar6)) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar6;
  }
  if (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
	Vector norms(input_->size(0));
	input_->l2NormRow(norms);
	std::vector<int32_t> idx(input_->size(0), 0);
	std::iota(idx.begin(), idx.end(), 0);
	auto eosid = dict_->getId(Dictionary::EOS);
	std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
		return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
	});
	idx.erase(idx.begin() + cutoff, idx.end());
	return idx;
}